

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v64_intrinsics_c.h
# Opt level: O3

c_v64 simd_test_sse4_1::c_imm_v64_shr_n_u16<14>(c_v64 a)

{
  c_v64 cVar1;
  
  cVar1._0_2_ = a.u16[0] >> 0xe;
  cVar1._2_2_ = a.u16[1] >> 0xe;
  cVar1._4_2_ = a.u16[2] >> 0xe;
  cVar1._6_2_ = a.u16[3] >> 0xe;
  return (c_v64)cVar1.u64;
}

Assistant:

SIMD_INLINE c_v64 c_v64_shr_u16(c_v64 a, unsigned int n) {
  c_v64 t;
  int c;
  if (SIMD_CHECK && n > 15) {
    fprintf(stderr, "Error: Undefined u16 shift right %d\n", n);
    abort();
  }
  for (c = 0; c < 4; c++) t.u16[c] = a.u16[c] >> n;
  return t;
}